

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SetMaximumPacketSize(RTPSession *this,size_t s)

{
  int iVar1;
  
  if (this->created == true) {
    if (s < 600) {
      iVar1 = -0x3d;
    }
    else {
      iVar1 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])
                        (this->rtptrans,s);
      if (-1 < iVar1) {
        iVar1 = RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,s);
        if (iVar1 < 0) {
          (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])
                    (this->rtptrans,this->maxpacksize);
        }
        else if ((this->rtcpbuilder).init == false) {
          RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,this->maxpacksize);
          (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1d])
                    (this->rtptrans,this->maxpacksize);
          iVar1 = -0x32;
        }
        else {
          (this->rtcpbuilder).maxpacketsize = s;
          this->maxpacksize = s;
          iVar1 = 0;
        }
      }
    }
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetMaximumPacketSize(size_t s)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	if (s < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
	
	int status;

	if ((status = rtptrans->SetMaximumPacketSize(s)) < 0)
		return status;

	BUILDER_LOCK
	if ((status = packetbuilder.SetMaximumPacketSize(s)) < 0)
	{
		BUILDER_UNLOCK
		// restore previous max packet size
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	if ((status = rtcpbuilder.SetMaximumPacketSize(s)) < 0)
	{
		// restore previous max packet size
		packetbuilder.SetMaximumPacketSize(maxpacksize);
		BUILDER_UNLOCK
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	BUILDER_UNLOCK
	maxpacksize = s;
	return 0;
}